

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_firstIndexOf_fromIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  undefined8 *puVar4;
  CharacterInstance *this_00;
  pointer lhs;
  long lVar5;
  shared_ptr<Instance> instance;
  undefined1 auStack_98 [104];
  int local_30;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)auStack_98,&this->_element_type);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)(auStack_98 + 0x10),
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  this_00 = (CharacterInstance *)(auStack_98 + 0x10);
  lVar5 = (long)local_30;
  CharacterInstance::~CharacterInstance(this_00);
  if (-1 < lVar5) {
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_30 <= (int)((ulong)((long)psVar2 - (long)psVar1) >> 4)) {
      lhs = psVar1 + lVar5;
      if (lhs != psVar2) {
        lVar5 = -(long)(psVar1 + lVar5);
        do {
          bVar3 = InstanceIsEqualToComparator::operator()
                            ((InstanceIsEqualToComparator *)this_00,lhs,
                             (shared_ptr<Instance> *)auStack_98);
          if (bVar3) {
            IntegerInstance::IntegerInstance
                      ((IntegerInstance *)(auStack_98 + 0x10),
                       (int)((ulong)-((long)&(((this->_value).
                                               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar5) >> 4));
            IntegerInstance::representation_abi_cxx11_
                      (__return_storage_ptr__,(IntegerInstance *)(auStack_98 + 0x10));
            CharacterInstance::~CharacterInstance((CharacterInstance *)(auStack_98 + 0x10));
            goto LAB_001489be;
          }
          lhs = lhs + 1;
          lVar5 = lVar5 + -0x10;
        } while (lhs != (this->_value).
                        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"-1","");
LAB_001489be:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98._8_8_);
      }
      return __return_storage_ptr__;
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_firstIndexOf_fromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (auto it = _value.begin() + from_index; it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}